

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attentional.h
# Opt level: O1

vector<float,_std::allocator<float>_> * __thiscall
dynet::AttentionalModel<dynet::LSTMBuilder>::auxiliary_vector
          (AttentionalModel<dynet::LSTMBuilder> *this)

{
  pointer *pppvVar1;
  vector<float,_std::allocator<float>_> *in_RAX;
  ulong uVar2;
  pointer ppvVar3;
  iterator __position;
  vector<float,_std::allocator<float>_> *local_28;
  
  uVar2 = (ulong)this->num_aux_vecs;
  ppvVar3 = (this->aux_vecs).
            super__Vector_base<std::vector<float,_std::allocator<float>_>_*,_std::allocator<std::vector<float,_std::allocator<float>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  __position._M_current =
       (this->aux_vecs).
       super__Vector_base<std::vector<float,_std::allocator<float>_>_*,_std::allocator<std::vector<float,_std::allocator<float>_>_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if ((ulong)((long)__position._M_current - (long)ppvVar3 >> 3) <= uVar2) {
    local_28 = in_RAX;
    do {
      local_28 = (vector<float,_std::allocator<float>_> *)operator_new(0x18);
      (local_28->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      (local_28->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      (local_28->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      if (__position._M_current ==
          (this->aux_vecs).
          super__Vector_base<std::vector<float,_std::allocator<float>_>_*,_std::allocator<std::vector<float,_std::allocator<float>_>_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<std::vector<float,std::allocator<float>>*,std::allocator<std::vector<float,std::allocator<float>>*>>
        ::_M_realloc_insert<std::vector<float,std::allocator<float>>*>
                  ((vector<std::vector<float,std::allocator<float>>*,std::allocator<std::vector<float,std::allocator<float>>*>>
                    *)&this->aux_vecs,__position,&local_28);
      }
      else {
        *__position._M_current = local_28;
        pppvVar1 = &(this->aux_vecs).
                    super__Vector_base<std::vector<float,_std::allocator<float>_>_*,_std::allocator<std::vector<float,_std::allocator<float>_>_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppvVar1 = *pppvVar1 + 1;
      }
      uVar2 = (ulong)this->num_aux_vecs;
      ppvVar3 = (this->aux_vecs).
                super__Vector_base<std::vector<float,_std::allocator<float>_>_*,_std::allocator<std::vector<float,_std::allocator<float>_>_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      __position._M_current =
           (this->aux_vecs).
           super__Vector_base<std::vector<float,_std::allocator<float>_>_*,_std::allocator<std::vector<float,_std::allocator<float>_>_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
    } while ((ulong)((long)__position._M_current - (long)ppvVar3 >> 3) <= uVar2);
  }
  this->num_aux_vecs = (int)uVar2 + 1;
  return ppvVar3[uVar2];
}

Assistant:

std::vector<float>* AttentionalModel<Builder>::auxiliary_vector()
{
    while (num_aux_vecs >= aux_vecs.size())
        aux_vecs.push_back(new std::vector<float>());
    // NB, we return the last auxiliary vector, AND increment counter
    return aux_vecs[num_aux_vecs++]; 
}